

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O2

CheckStreamRez * __thiscall
HEVCStreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,HEVCStreamReader *this,uint8_t *buffer,int len)

{
  string *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *buffer_00;
  byte *end;
  HevcVpsUnit *this_01;
  HevcSpsUnit *pHVar4;
  HevcPpsUnit *this_02;
  long lVar5;
  byte *end_00;
  NalType nalType;
  byte *end_01;
  allocator<char> local_e1;
  CheckStreamRez *local_e0;
  byte *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_e0 = __return_storage_ptr__;
  CheckStreamRez::CheckStreamRez(__return_storage_ptr__);
  end_01 = buffer + len;
  buffer_00 = NALUnit::findNextNAL(buffer,end_01);
  local_d8 = end_01 + -4;
  for (; buffer_00 < local_d8; buffer_00 = NALUnit::findNextNAL(buffer_00,end_01)) {
    bVar1 = *buffer_00;
    if ((char)bVar1 < '\0') {
      return local_e0;
    }
    end = NALUnit::findNALWithStartCode(buffer_00,end_01,true);
    if ((end == end_01) && ((this->super_MPEGStreamReader).m_eof == false)) break;
    bVar1 = bVar1 >> 1;
    nalType = (NalType)bVar1;
    switch(nalType) {
    case VPS:
      this_01 = this->m_vps;
      if (this_01 == (HevcVpsUnit *)0x0) {
        this_01 = (HevcVpsUnit *)operator_new(0x50);
        HevcVpsUnit::HevcVpsUnit(this_01);
        this->m_vps = this_01;
      }
      HevcUnit::decodeBuffer((HevcUnit *)this_01,buffer_00,end);
      iVar3 = HevcVpsUnit::deserialize(this->m_vps);
      if (iVar3 != 0) {
        return local_e0;
      }
      (this->super_MPEGStreamReader).m_spsPpsFound = true;
      if (this->m_vps->num_units_in_tick != 0) {
        MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,this->m_vps,buffer_00,end,0);
      }
      break;
    case SPS:
      pHVar4 = this->m_sps;
      if (pHVar4 == (HevcSpsUnit *)0x0) {
        pHVar4 = (HevcSpsUnit *)operator_new(0xa0);
        HevcSpsUnit::HevcSpsUnit(pHVar4);
        this->m_sps = pHVar4;
      }
      HevcUnit::decodeBuffer((HevcUnit *)pHVar4,buffer_00,end);
      iVar3 = HevcSpsUnit::deserialize(this->m_sps);
      if (iVar3 != 0) {
        return local_e0;
      }
      (this->super_MPEGStreamReader).m_spsPpsFound = true;
      MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,this->m_sps,buffer_00,end,0);
      break;
    case PPS:
      this_02 = this->m_pps;
      if (this_02 == (HevcPpsUnit *)0x0) {
        this_02 = (HevcPpsUnit *)operator_new(0x48);
        HevcPpsUnit::HevcPpsUnit(this_02);
        this->m_pps = this_02;
      }
      HevcUnit::decodeBuffer(&this_02->super_HevcUnit,buffer_00,end);
      iVar3 = HevcPpsUnit::deserialize(this->m_pps);
      goto LAB_0019f2aa;
    case AUD:
    case EOS:
    case EOB:
    case FD:
      break;
    case SEI_PREFIX:
      HevcUnit::decodeBuffer(&this->m_hdr->super_HevcUnit,buffer_00,end);
      iVar3 = HevcHdrUnit::deserialize(this->m_hdr);
LAB_0019f2aa:
      if (iVar3 != 0) {
        return local_e0;
      }
      break;
    default:
      if ((nalType - DVRPU < 2) && (buffer_00[1] == 1)) {
        if (bVar1 == 0x3f) {
          this->m_hdr->isDVEL = true;
        }
        else {
          this->m_hdr->isDVRPU = true;
        }
        V3_flags._0_1_ = (byte)V3_flags | 4;
      }
    }
    bVar2 = isSlice(this,nalType);
    if ((bVar2) && ((char)buffer_00[2] < '\0')) {
      end_00 = buffer_00 + 0x40;
      if (end < buffer_00 + 0x40) {
        end_00 = end;
      }
      HevcUnit::decodeBuffer(&this->m_slice->super_HevcUnit,buffer_00,end_00);
      iVar3 = HevcSliceHeader::deserialize(this->m_slice,this->m_sps,this->m_pps);
      if (iVar3 != 0) {
        return local_e0;
      }
      iVar3 = toFullPicOrder(this,this->m_slice,this->m_sps->log2_max_pic_order_cnt_lsb);
      this->m_fullPicOrder = iVar3;
      incTimings(this);
    }
  }
  this->m_frameNum = 0;
  this->m_fullPicOrder = 0;
  (this->super_MPEGStreamReader).m_totalFrameNum = 0;
  (this->super_MPEGStreamReader).m_curPts = 0;
  (this->super_MPEGStreamReader).m_curDts = 0;
  if ((((this->m_vps != (HevcVpsUnit *)0x0) && (pHVar4 = this->m_sps, pHVar4 != (HevcSpsUnit *)0x0))
      && (this->m_pps != (HevcPpsUnit *)0x0)) &&
     ((*(uint *)&(this->m_vps->super_HevcUnitWithProfile).field_0x3c ==
       (uint)(byte)(pHVar4->super_HevcUnitWithProfile).field_0x3b &&
      (this->m_pps->sps_id == pHVar4->sps_id)))) {
    if ((pHVar4->colour_primaries == '\t') &&
       ((pHVar4->transfer_characteristics == '\x10' && (pHVar4->matrix_coeffs == '\t')))) {
      this->m_hdr->isHDR10 = true;
      V3_flags._0_1_ = (byte)V3_flags | 2;
    }
    CodecInfo::operator=(&local_e0->codecInfo,&::hevcCodecInfo);
    HevcSpsUnit::getDescription_abi_cxx11_(&local_50,this->m_sps);
    this_00 = &local_e0->streamDescr;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar5 = std::__cxx11::string::find((char *)this_00,0x204a63);
    if (lVar5 != -1) {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)this_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0," ",&local_e1);
      std::operator+(&local_70,&local_90,&local_b0);
      HevcVpsUnit::getDescription_abi_cxx11_(&local_d0,this->m_vps);
      std::operator+(&local_50,&local_70,&local_d0);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  return local_e0;
}

Assistant:

CheckStreamRez HEVCStreamReader::checkStream(uint8_t* buffer, const int len)
{
    CheckStreamRez rez;

    uint8_t* end = buffer + len;
    for (uint8_t* nal = NALUnit::findNextNAL(buffer, end); nal < end - 4; nal = NALUnit::findNextNAL(nal, end))
    {
        if (*nal & 0x80)
            return rez;  // invalid nal
        const auto nalType = static_cast<HevcUnit::NalType>((*nal >> 1) & 0x3f);
        uint8_t* nextNal = NALUnit::findNALWithStartCode(nal, end, true);
        if (!m_eof && nextNal == end)
            break;

        switch (nalType)
        {
        case HevcUnit::NalType::VPS:
            if (!m_vps)
                m_vps = new HevcVpsUnit();
            m_vps->decodeBuffer(nal, nextNal);
            if (m_vps->deserialize() != 0)
                return rez;
            m_spsPpsFound = true;
            if (m_vps->num_units_in_tick)
                updateFPS(m_vps, nal, nextNal, 0);
            break;
        case HevcUnit::NalType::SPS:
            if (!m_sps)
                m_sps = new HevcSpsUnit();
            m_sps->decodeBuffer(nal, nextNal);
            if (m_sps->deserialize() != 0)
                return rez;
            m_spsPpsFound = true;
            updateFPS(m_sps, nal, nextNal, 0);
            break;
        case HevcUnit::NalType::PPS:
            if (!m_pps)
                m_pps = new HevcPpsUnit();
            m_pps->decodeBuffer(nal, nextNal);
            if (m_pps->deserialize() != 0)
                return rez;
            break;
        case HevcUnit::NalType::SEI_PREFIX:
            m_hdr->decodeBuffer(nal, nextNal);
            if (m_hdr->deserialize() != 0)
                return rez;
            break;
        case HevcUnit::NalType::DVRPU:
        case HevcUnit::NalType::DVEL:
            if (nal[1] == 1)
            {
                if (nalType == HevcUnit::NalType::DVEL)
                    m_hdr->isDVEL = true;
                else
                    m_hdr->isDVRPU = true;
                V3_flags |= DV;
            }
            break;
        default:
            break;
        }

        // check Frame Depth on first slices
        if (isSlice(nalType) && (nal[2] & 0x80))
        {
            m_slice->decodeBuffer(nal, FFMIN(nal + MAX_SLICE_HEADER, nextNal));
            if (m_slice->deserialize(m_sps, m_pps))
                return rez;  // not enough buffer or error
            m_fullPicOrder = toFullPicOrder(m_slice, m_sps->log2_max_pic_order_cnt_lsb);
            incTimings();
        }
    }
    m_totalFrameNum = m_frameNum = m_fullPicOrder = 0;
    m_curDts = m_curPts = 0;

    // Set HDR10 flag if PQ detected
    if (m_vps && m_sps && m_pps && m_sps->vps_id == m_vps->vps_id && m_pps->sps_id == m_sps->sps_id)
    {
        if (m_sps->colour_primaries == 9 && m_sps->transfer_characteristics == 16 &&
            m_sps->matrix_coeffs == 9)  // SMPTE.ST.2084 (PQ)
        {
            m_hdr->isHDR10 = true;
            V3_flags |= HDR10;
        }

        rez.codecInfo = hevcCodecInfo;
        rez.streamDescr = m_sps->getDescription();
        const size_t frSpsPos = rez.streamDescr.find("Frame rate: not found");
        if (frSpsPos != string::npos)
            rez.streamDescr = rez.streamDescr.substr(0, frSpsPos) + string(" ") + m_vps->getDescription();
    }

    return rez;
}